

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

ssize_t ossl_recv(Curl_easy *data,int num,char *buf,size_t buffersize,CURLcode *curlcode)

{
  uint err_00;
  connectdata *conn_00;
  ssl_backend_data *psVar1;
  int iVar2;
  ulong error;
  uint *puVar3;
  char *__src;
  int local_174;
  int sockerr;
  int err;
  ssl_backend_data *backend;
  ssl_connect_data *connssl;
  connectdata *conn;
  int buffsize;
  ssize_t nread;
  unsigned_long sslerror;
  char error_buffer [256];
  CURLcode *curlcode_local;
  size_t buffersize_local;
  char *buf_local;
  int num_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  psVar1 = conn_00->ssl[num].backend;
  error_buffer._248_8_ = curlcode;
  ERR_clear_error();
  if (buffersize < 0x80000000) {
    local_174 = (int)buffersize;
  }
  else {
    local_174 = 0x7fffffff;
  }
  (conn_00->ssl[0].backend)->logger = data;
  iVar2 = SSL_read((SSL *)psVar1->handle,buf,local_174);
  data_local = (Curl_easy *)(long)iVar2;
  if (((long)data_local < 1) && (iVar2 = SSL_get_error((SSL *)psVar1->handle,iVar2), iVar2 != 0)) {
    if (iVar2 - 2U < 2) {
      *(undefined4 *)error_buffer._248_8_ = 0x51;
      data_local = (Curl_easy *)0xffffffffffffffff;
    }
    else if (iVar2 == 6) {
      if (num == 0) {
        Curl_conncontrol(conn_00,1);
      }
    }
    else {
      error = ERR_get_error();
      if (((long)data_local < 0) || (error != 0)) {
        puVar3 = (uint *)__errno_location();
        err_00 = *puVar3;
        if (error == 0) {
          if ((err_00 == 0) || (iVar2 != 5)) {
            __src = SSL_ERROR_to_str(iVar2);
            strncpy((char *)&sslerror,__src,0x100);
            error_buffer[0xf7] = '\0';
          }
          else {
            Curl_strerror(err_00,(char *)&sslerror,0x100);
          }
        }
        else {
          ossl_strerror(error,(char *)&sslerror,0x100);
        }
        Curl_failf(data,"OpenSSL SSL_read: %s, errno %d",&sslerror,(ulong)err_00);
        *(undefined4 *)error_buffer._248_8_ = 0x38;
        data_local = (Curl_easy *)0xffffffffffffffff;
      }
    }
  }
  return (ssize_t)data_local;
}

Assistant:

static ssize_t ossl_recv(struct Curl_easy *data,   /* transfer */
                         int num,                  /* socketindex */
                         char *buf,                /* store read data here */
                         size_t buffersize,        /* max amount to read */
                         CURLcode *curlcode)
{
  char error_buffer[256];
  unsigned long sslerror;
  ssize_t nread;
  int buffsize;
  struct connectdata *conn = data->conn;
  struct ssl_connect_data *connssl = &conn->ssl[num];
  struct ssl_backend_data *backend = connssl->backend;

  ERR_clear_error();

  buffsize = (buffersize > (size_t)INT_MAX) ? INT_MAX : (int)buffersize;
  set_logger(conn, data);
  nread = (ssize_t)SSL_read(backend->handle, buf, buffsize);
  if(nread <= 0) {
    /* failed SSL_read */
    int err = SSL_get_error(backend->handle, (int)nread);

    switch(err) {
    case SSL_ERROR_NONE: /* this is not an error */
      break;
    case SSL_ERROR_ZERO_RETURN: /* no more data */
      /* close_notify alert */
      if(num == FIRSTSOCKET)
        /* mark the connection for close if it is indeed the control
           connection */
        connclose(conn, "TLS close_notify");
      break;
    case SSL_ERROR_WANT_READ:
    case SSL_ERROR_WANT_WRITE:
      /* there's data pending, re-invoke SSL_read() */
      *curlcode = CURLE_AGAIN;
      return -1;
    default:
      /* openssl/ssl.h for SSL_ERROR_SYSCALL says "look at error stack/return
         value/errno" */
      /* https://www.openssl.org/docs/crypto/ERR_get_error.html */
      sslerror = ERR_get_error();
      if((nread < 0) || sslerror) {
        /* If the return code was negative or there actually is an error in the
           queue */
        int sockerr = SOCKERRNO;
        if(sslerror)
          ossl_strerror(sslerror, error_buffer, sizeof(error_buffer));
        else if(sockerr && err == SSL_ERROR_SYSCALL)
          Curl_strerror(sockerr, error_buffer, sizeof(error_buffer));
        else {
          strncpy(error_buffer, SSL_ERROR_to_str(err), sizeof(error_buffer));
          error_buffer[sizeof(error_buffer) - 1] = '\0';
        }
        failf(data, OSSL_PACKAGE " SSL_read: %s, errno %d",
              error_buffer, sockerr);
        *curlcode = CURLE_RECV_ERROR;
        return -1;
      }
      /* For debug builds be a little stricter and error on any
         SSL_ERROR_SYSCALL. For example a server may have closed the connection
         abruptly without a close_notify alert. For compatibility with older
         peers we don't do this by default. #4624

         We can use this to gauge how many users may be affected, and
         if it goes ok eventually transition to allow in dev and release with
         the newest OpenSSL: #if (OPENSSL_VERSION_NUMBER >= 0x10101000L) */
#ifdef DEBUGBUILD
      if(err == SSL_ERROR_SYSCALL) {
        int sockerr = SOCKERRNO;
        if(sockerr)
          Curl_strerror(sockerr, error_buffer, sizeof(error_buffer));
        else {
          msnprintf(error_buffer, sizeof(error_buffer),
                    "Connection closed abruptly");
        }
        failf(data, OSSL_PACKAGE " SSL_read: %s, errno %d"
              " (Fatal because this is a curl debug build)",
              error_buffer, sockerr);
        *curlcode = CURLE_RECV_ERROR;
        return -1;
      }
#endif
    }
  }
  return nread;
}